

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

xmlParserInputPtr
xmlCtxtNewInputFromMemory
          (xmlParserCtxtPtr ctxt,char *url,void *mem,size_t size,char *encoding,int flags)

{
  xmlParserInputPtr input;
  
  if (mem != (void *)0x0 && ctxt != (xmlParserCtxtPtr)0x0) {
    input = xmlNewInputFromMemory(url,mem,size,flags);
    if (input != (xmlParserInputPtr)0x0) {
      if (encoding == (char *)0x0) {
        return input;
      }
      xmlSwitchInputEncodingName(ctxt,input,encoding);
      return input;
    }
    xmlCtxtErrMemory(ctxt);
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlCtxtNewInputFromMemory(xmlParserCtxtPtr ctxt, const char *url,
                          const void *mem, size_t size,
                          const char *encoding, int flags) {
    xmlParserInputPtr input;

    if ((ctxt == NULL) || (mem == NULL))
	return(NULL);

    input = xmlNewInputFromMemory(url, mem, size, flags);
    if (input == NULL) {
        xmlCtxtErrMemory(ctxt);
        return(NULL);
    }

    if (encoding != NULL)
        xmlSwitchInputEncodingName(ctxt, input, encoding);

    return(input);
}